

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

int_fast64_t
absl::lts_20240722::time_internal::cctz::anon_unknown_0::TransOffset
          (bool leap_year,int jan1_weekday,PosixTransition *pt)

{
  DateFormat DVar1;
  int iVar2;
  anon_union_8_3_4e90bb4b_for_Date_1 aVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  DVar1 = (pt->date).fmt;
  if (DVar1 == M) {
    lVar7 = (long)(pt->date).field_1.m.week;
    lVar6 = (long)*(short *)((anonymous_namespace)::kMonthOffsets +
                            ((ulong)(lVar7 == 5) + (long)(pt->date).field_1.m.month) * 2 +
                            (ulong)leap_year * 0x1c);
    iVar2 = (int)(pt->date).field_1.m.weekday;
    iVar4 = (int)((jan1_weekday + lVar6) % 7);
    if (lVar7 == 5) {
      uVar5 = (iVar4 - iVar2) + 6;
      aVar3 = (anon_union_8_3_4e90bb4b_for_Date_1)
              ((short)~(ushort)((int)((uint)(ushort)((short)uVar5 >> 0xf) << 0x10 | uVar5 & 0xffff)
                               % 7) + lVar6);
    }
    else {
      uVar5 = (iVar2 - iVar4) + 7;
      aVar3 = (anon_union_8_3_4e90bb4b_for_Date_1)
              ((long)(short)((int)((uint)(ushort)((short)uVar5 >> 0xf) << 0x10 | uVar5 & 0xffff) % 7
                            ) + lVar7 * 7 + lVar6 + -7);
    }
  }
  else if (DVar1 == N) {
    aVar3 = (pt->date).field_1;
  }
  else if (DVar1 == J) {
    aVar3 = (pt->date).field_1;
    aVar3 = (anon_union_8_3_4e90bb4b_for_Date_1)
            ((long)aVar3 - (ulong)(!leap_year || (long)aVar3 < 0x3c));
  }
  else {
    aVar3 = (anon_union_8_3_4e90bb4b_for_Date_1)0x0;
  }
  return (long)aVar3 * 0x15180 + (pt->time).offset;
}

Assistant:

std::int_fast64_t TransOffset(bool leap_year, int jan1_weekday,
                              const PosixTransition& pt) {
  std::int_fast64_t days = 0;
  switch (pt.date.fmt) {
    case PosixTransition::J: {
      days = pt.date.j.day;
      if (!leap_year || days < kMonthOffsets[1][3]) days -= 1;
      break;
    }
    case PosixTransition::N: {
      days = pt.date.n.day;
      break;
    }
    case PosixTransition::M: {
      const bool last_week = (pt.date.m.week == 5);
      days = kMonthOffsets[leap_year][pt.date.m.month + last_week];
      const std::int_fast64_t weekday = (jan1_weekday + days) % 7;
      if (last_week) {
        days -= (weekday + 7 - 1 - pt.date.m.weekday) % 7 + 1;
      } else {
        days += (pt.date.m.weekday + 7 - weekday) % 7;
        days += (pt.date.m.week - 1) * 7;
      }
      break;
    }
  }
  return (days * kSecsPerDay) + pt.time.offset;
}